

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoAssignOneClass2(Gia_IsoMan_t *p)

{
  int *piVar1;
  Vec_Int_t *p_00;
  int iVar2;
  uint uVar3;
  uint local_1c;
  int local_18;
  int nSize;
  int iBegin;
  int i;
  Gia_IsoMan_t *p_local;
  
  local_18 = -1;
  local_1c = 0xffffffff;
  iVar2 = Vec_IntSize(p->vClasses);
  if (iVar2 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x204,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
  }
  for (nSize = 0; iVar2 = Vec_IntSize(p->vClasses), nSize + 1 < iVar2; nSize = nSize + 2) {
    local_18 = Vec_IntEntry(p->vClasses,nSize);
    local_1c = Vec_IntEntry(p->vClasses,nSize + 1);
    if (local_1c == 2) break;
  }
  if ((int)local_1c < 2) {
    __assert_fail("nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x20a,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
  }
  if (local_1c == 2) {
    piVar1 = p->pUniques;
    uVar3 = Gia_IsoGetItem(p,local_18);
    if (piVar1[uVar3] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x20e,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
    }
    iVar2 = p->nUniques;
    p->nUniques = iVar2 + 1;
    piVar1 = p->pUniques;
    uVar3 = Gia_IsoGetItem(p,local_18);
    piVar1[uVar3] = iVar2;
    p->nSingles = p->nSingles + 1;
    p->nEntries = p->nEntries + -1;
    piVar1 = p->pUniques;
    uVar3 = Gia_IsoGetItem(p,local_18 + 1);
    if (piVar1[uVar3] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x213,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
    }
    iVar2 = p->nUniques;
    p->nUniques = iVar2 + 1;
    piVar1 = p->pUniques;
    uVar3 = Gia_IsoGetItem(p,local_18 + 1);
    piVar1[uVar3] = iVar2;
    p->nSingles = p->nSingles + 1;
    p->nEntries = p->nEntries + -1;
  }
  else {
    piVar1 = p->pUniques;
    uVar3 = Gia_IsoGetItem(p,local_18);
    if (piVar1[uVar3] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x21a,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
    }
    iVar2 = p->nUniques;
    p->nUniques = iVar2 + 1;
    piVar1 = p->pUniques;
    uVar3 = Gia_IsoGetItem(p,local_18);
    piVar1[uVar3] = iVar2;
    p->nSingles = p->nSingles + 1;
    p->nEntries = p->nEntries + -1;
  }
  for (; iVar2 = Vec_IntSize(p->vClasses), nSize < iVar2 + -2; nSize = nSize + 2) {
    p->vClasses->pArray[nSize] = p->vClasses->pArray[nSize + 2];
    p->vClasses->pArray[nSize + 1] = p->vClasses->pArray[nSize + 3];
  }
  p_00 = p->vClasses;
  iVar2 = Vec_IntSize(p->vClasses);
  Vec_IntShrink(p_00,iVar2 + -2);
  piVar1 = p->pLevels;
  uVar3 = Gia_IsoGetItem(p,local_18);
  printf("Broke ties in class %d of size %d at level %d.\n",(ulong)(uint)(nSize / 2),(ulong)local_1c
         ,(ulong)(uint)piVar1[uVar3]);
  return;
}

Assistant:

void Gia_IsoAssignOneClass2( Gia_IsoMan_t * p )
{
    int i, iBegin = -1, nSize = -1;
    // find two variable class
    assert( Vec_IntSize(p->vClasses) > 0 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        if ( nSize == 2 )
            break;
    }
    assert( nSize > 1 );

    if ( nSize == 2 )
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;

        assert( p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin+1)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    else
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }

    for ( ; i < Vec_IntSize(p->vClasses) - 2; i += 2 )
    {
        p->vClasses->pArray[i+0] = p->vClasses->pArray[i+2];
        p->vClasses->pArray[i+1] = p->vClasses->pArray[i+3];
    }
    Vec_IntShrink( p->vClasses, Vec_IntSize(p->vClasses) - 2 );

    printf( "Broke ties in class %d of size %d at level %d.\n", i/2, nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
}